

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# validation.cpp
# Opt level: O3

bool ContextualCheckBlock
               (CBlock *block,BlockValidationState *state,ChainstateManager *chainman,
               CBlockIndex *pindexPrev)

{
  vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
  *v;
  uint uVar1;
  pointer psVar2;
  uint uVar3;
  bool bVar4;
  byte bVar5;
  ulong nBlockTime;
  prevector<28U,_unsigned_char,_unsigned_int,_int> *ppVar6;
  CChainParams *pCVar7;
  int iVar8;
  long lVar9;
  uint uVar10;
  pointer psVar11;
  int iVar12;
  long lVar13;
  long in_FS_OFFSET;
  string local_98;
  undefined1 local_78 [32];
  undefined1 local_58 [32];
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  if (pindexPrev == (CBlockIndex *)0x0) {
    iVar12 = 0;
    if ((((chainman->m_options).chainparams)->consensus).CSVHeight < 1) {
      __assert_fail("pindexPrev != nullptr",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/validation.cpp"
                    ,0x107a,
                    "bool ContextualCheckBlock(const CBlock &, BlockValidationState &, const ChainstateManager &, const CBlockIndex *)"
                   );
    }
LAB_00ae3f10:
    nBlockTime = (ulong)(block->super_CBlockHeader).nTime;
  }
  else {
    iVar12 = pindexPrev->nHeight + 1;
    if (iVar12 < (((chainman->m_options).chainparams)->consensus).CSVHeight) goto LAB_00ae3f10;
    nBlockTime = CBlockIndex::GetMedianTimePast(pindexPrev);
  }
  psVar2 = (block->vtx).
           super__Vector_base<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  for (psVar11 = (block->vtx).
                 super__Vector_base<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
                 ._M_impl.super__Vector_impl_data._M_start; psVar11 != psVar2; psVar11 = psVar11 + 1
      ) {
    bVar4 = IsFinalTx((psVar11->super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>).
                      _M_ptr,iVar12,nBlockTime);
    if (!bVar4) {
      local_58._0_8_ = local_58 + 0x10;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_58,"bad-txns-nonfinal","");
      local_78._0_8_ = local_78 + 0x10;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_78,"non-final transaction","")
      ;
      bVar5 = ValidationState<BlockValidationResult>::Invalid
                        (&state->super_ValidationState<BlockValidationResult>,BLOCK_CONSENSUS,
                         (string *)local_58,(string *)local_78);
      if ((undefined1 *)local_78._0_8_ == local_78 + 0x10) goto LAB_00ae3fd4;
      goto LAB_00ae3fc7;
    }
  }
  pCVar7 = (chainman->m_options).chainparams;
  if (pindexPrev == (CBlockIndex *)0x0) {
    iVar8 = 0;
  }
  else {
    iVar8 = pindexPrev->nHeight + 1;
  }
  v = &block->vtx;
  if ((pCVar7->consensus).BIP34Height <= iVar8) {
    local_78._16_8_ = 0;
    local_78._24_8_ = 0;
    local_78._0_8_ = (pointer)0x0;
    local_78._8_8_ = 0;
    ppVar6 = &CScript::push_int64((CScript *)local_78,(long)iVar12)->super_CScriptBase;
    prevector<28U,_unsigned_char,_unsigned_int,_int>::prevector
              ((prevector<28U,_unsigned_char,_unsigned_int,_int> *)local_58,ppVar6);
    if (0x1c < (uint)local_78._28_4_) {
      free((void *)local_78._0_8_);
    }
    lVar9 = *(long *)&((((v->
                         super__Vector_base<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
                         )._M_impl.super__Vector_impl_data._M_start)->
                       super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>)._M_ptr)->
                      vin;
    uVar1 = *(uint *)(lVar9 + 0x44);
    uVar3 = uVar1 - 0x1d;
    if (uVar1 < 0x1d) {
      uVar3 = uVar1;
    }
    uVar10 = local_58._28_4_ - 0x1d;
    if ((uint)local_58._28_4_ < 0x1d) {
      uVar10 = local_58._28_4_;
    }
    if (uVar3 < uVar10) {
LAB_00ae4069:
      local_78._0_8_ = local_78 + 0x10;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_78,"bad-cb-height","");
      local_98._M_dataplus._M_p = (pointer)&local_98.field_2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_98,"block height mismatch in coinbase","");
      bVar4 = ValidationState<BlockValidationResult>::Invalid
                        (&state->super_ValidationState<BlockValidationResult>,BLOCK_CONSENSUS,
                         (string *)local_78,&local_98);
      ppVar6 = (prevector<28U,_unsigned_char,_unsigned_int,_int> *)(ulong)bVar4;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_98._M_dataplus._M_p != &local_98.field_2) {
        operator_delete(local_98._M_dataplus._M_p,local_98.field_2._M_allocated_capacity + 1);
      }
      if ((undefined1 *)local_78._0_8_ != local_78 + 0x10) {
        operator_delete((void *)local_78._0_8_,local_78._16_8_ + 1);
      }
      bVar4 = false;
    }
    else {
      ppVar6 = (prevector<28U,_unsigned_char,_unsigned_int,_int> *)local_58;
      if (0x1c < (uint)local_58._28_4_) {
        ppVar6 = (prevector<28U,_unsigned_char,_unsigned_int,_int> *)local_58._0_8_;
      }
      bVar4 = true;
      if (uVar10 != 0) {
        if (uVar1 < 0x1d) {
          lVar9 = lVar9 + 0x28;
        }
        else {
          lVar9 = *(long *)(lVar9 + 0x28);
        }
        lVar13 = 0;
        do {
          if ((ppVar6->_union).direct[lVar13] != *(char *)(lVar9 + lVar13)) goto LAB_00ae4069;
          lVar13 = lVar13 + 1;
        } while ((int)uVar10 != lVar13);
      }
    }
    bVar5 = (byte)ppVar6;
    if (0x1c < (uint)local_58._28_4_) {
      free((void *)local_58._0_8_);
    }
    if (!bVar4) goto LAB_00ae425c;
    pCVar7 = (chainman->m_options).chainparams;
  }
  if (pindexPrev == (CBlockIndex *)0x0) {
    iVar12 = 0;
  }
  else {
    iVar12 = pindexPrev->nHeight + 1;
  }
  bVar4 = CheckWitnessMalleation(block,(pCVar7->consensus).SegwitHeight <= iVar12,state);
  if (bVar4) {
    local_58._0_8_ = &TX_NO_WITNESS;
    local_78._0_8_ = &DAT_00000050;
    local_58._8_8_ = local_78;
    VectorFormatter<DefaultFormatter>::
    Ser<ParamsStream<SizeComputer&,TransactionSerParams>,std::vector<std::shared_ptr<CTransaction_const>,std::allocator<std::shared_ptr<CTransaction_const>>>>
              ((VectorFormatter<DefaultFormatter> *)&local_98,
               (ParamsStream<SizeComputer_&,_TransactionSerParams> *)local_58,v);
    lVar9 = local_78._0_8_ * 3;
    local_58._0_8_ = &TX_WITH_WITNESS;
    local_78._0_8_ = &DAT_00000050;
    local_58._8_8_ = local_78;
    VectorFormatter<DefaultFormatter>::
    Ser<ParamsStream<SizeComputer&,TransactionSerParams>,std::vector<std::shared_ptr<CTransaction_const>,std::allocator<std::shared_ptr<CTransaction_const>>>>
              ((VectorFormatter<DefaultFormatter> *)&local_98,
               (ParamsStream<SizeComputer_&,_TransactionSerParams> *)local_58,v);
    bVar5 = 1;
    if (4000000 < (long)(local_78._0_8_ + lVar9)) {
      local_58._0_8_ = local_58 + 0x10;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_58,"bad-blk-weight","");
      tinyformat::format<char[21]>
                ((string *)local_78,"%s : weight limit failed",(char (*) [21])"ContextualCheckBlock"
                );
      bVar5 = ValidationState<BlockValidationResult>::Invalid
                        (&state->super_ValidationState<BlockValidationResult>,BLOCK_CONSENSUS,
                         (string *)local_58,(string *)local_78);
      if ((undefined1 *)local_78._0_8_ != local_78 + 0x10) {
LAB_00ae3fc7:
        operator_delete((void *)local_78._0_8_,local_78._16_8_ + 1);
      }
LAB_00ae3fd4:
      if ((prevector<28U,_unsigned_char,_unsigned_int,_int> *)local_58._0_8_ !=
          (prevector<28U,_unsigned_char,_unsigned_int,_int> *)(local_58 + 0x10)) {
        operator_delete((void *)local_58._0_8_,local_58._16_8_ + 1);
      }
    }
  }
  else {
    bVar5 = 0;
  }
LAB_00ae425c:
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return (bool)(bVar5 & 1);
}

Assistant:

static bool ContextualCheckBlock(const CBlock& block, BlockValidationState& state, const ChainstateManager& chainman, const CBlockIndex* pindexPrev)
{
    const int nHeight = pindexPrev == nullptr ? 0 : pindexPrev->nHeight + 1;

    // Enforce BIP113 (Median Time Past).
    bool enforce_locktime_median_time_past{false};
    if (DeploymentActiveAfter(pindexPrev, chainman, Consensus::DEPLOYMENT_CSV)) {
        assert(pindexPrev != nullptr);
        enforce_locktime_median_time_past = true;
    }

    const int64_t nLockTimeCutoff{enforce_locktime_median_time_past ?
                                      pindexPrev->GetMedianTimePast() :
                                      block.GetBlockTime()};

    // Check that all transactions are finalized
    for (const auto& tx : block.vtx) {
        if (!IsFinalTx(*tx, nHeight, nLockTimeCutoff)) {
            return state.Invalid(BlockValidationResult::BLOCK_CONSENSUS, "bad-txns-nonfinal", "non-final transaction");
        }
    }

    // Enforce rule that the coinbase starts with serialized block height
    if (DeploymentActiveAfter(pindexPrev, chainman, Consensus::DEPLOYMENT_HEIGHTINCB))
    {
        CScript expect = CScript() << nHeight;
        if (block.vtx[0]->vin[0].scriptSig.size() < expect.size() ||
            !std::equal(expect.begin(), expect.end(), block.vtx[0]->vin[0].scriptSig.begin())) {
            return state.Invalid(BlockValidationResult::BLOCK_CONSENSUS, "bad-cb-height", "block height mismatch in coinbase");
        }
    }

    // Validation for witness commitments.
    // * We compute the witness hash (which is the hash including witnesses) of all the block's transactions, except the
    //   coinbase (where 0x0000....0000 is used instead).
    // * The coinbase scriptWitness is a stack of a single 32-byte vector, containing a witness reserved value (unconstrained).
    // * We build a merkle tree with all those witness hashes as leaves (similar to the hashMerkleRoot in the block header).
    // * There must be at least one output whose scriptPubKey is a single 36-byte push, the first 4 bytes of which are
    //   {0xaa, 0x21, 0xa9, 0xed}, and the following 32 bytes are SHA256^2(witness root, witness reserved value). In case there are
    //   multiple, the last one is used.
    if (!CheckWitnessMalleation(block, DeploymentActiveAfter(pindexPrev, chainman, Consensus::DEPLOYMENT_SEGWIT), state)) {
        return false;
    }

    // After the coinbase witness reserved value and commitment are verified,
    // we can check if the block weight passes (before we've checked the
    // coinbase witness, it would be possible for the weight to be too
    // large by filling up the coinbase witness, which doesn't change
    // the block hash, so we couldn't mark the block as permanently
    // failed).
    if (GetBlockWeight(block) > MAX_BLOCK_WEIGHT) {
        return state.Invalid(BlockValidationResult::BLOCK_CONSENSUS, "bad-blk-weight", strprintf("%s : weight limit failed", __func__));
    }

    return true;
}